

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
 __thiscall
chaiscript::
make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,chaiscript::eval::Scopeless_Block_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>,std::__cxx11::string_const&,chaiscript::Parse_Location&,std::vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>>>>
          (chaiscript *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          Parse_Location *arg_1,
          vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
          *arg_2)

{
  pointer __p;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  local_90;
  Parse_Location local_78;
  string local_48;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  *local_28;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  *arg_local_2;
  Parse_Location *arg_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local;
  
  local_28 = arg_2;
  arg_local_2 = (vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                 *)arg_1;
  arg_local_1 = (Parse_Location *)arg;
  arg_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  __p = (pointer)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg_local_1);
  Parse_Location::Parse_Location(&local_78,(Parse_Location *)arg_local_2);
  Catch::clara::std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ::vector(&local_90,local_28);
  eval::Scopeless_Block_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::Scopeless_Block_AST_Node
            ((Scopeless_Block_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *)__p,&local_48,
             &local_78,&local_90);
  std::
  unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>
  ::
  unique_ptr<std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>,void>
            ((unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>
              *)this,__p);
  Catch::clara::std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ::~vector(&local_90);
  Parse_Location::~Parse_Location(&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>,_true,_true>
          )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<B> make_unique(Arg &&...arg) {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_unique<D>(std::forward<Arg>(arg)...);
#else
    return std::unique_ptr<B>(static_cast<B *>(new D(std::forward<Arg>(arg)...)));
#endif
  }